

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O1

string * __thiscall
DeleteMessage::execute_abi_cxx11_(string *__return_storage_ptr__,DeleteMessage *this)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  long *plVar10;
  int iVar11;
  string dir;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  string *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string
            ((string *)local_60,(this->super_ServerOperation).MESSAGEDIR,&local_b1);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_60);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar9;
    local_b0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(this->username)._M_dataplus._M_p);
  local_80 = &local_70;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_70 = *plVar10;
    lStack_68 = plVar5[3];
  }
  else {
    local_70 = *plVar10;
    local_80 = (long *)*plVar5;
  }
  local_78 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  __dirp = opendir((char *)local_80);
  if (__dirp == (DIR *)0x0) {
    pcVar1 = (this->super_ServerOperation).FAILURE;
    pcVar2 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_ServerOperation).statusMessage,0,pcVar2,(ulong)pcVar1);
    closedir((DIR *)0x0);
    std::operator+(&local_b0,"No such User \"",&this->username);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  else {
    local_38 = (this->super_ServerOperation).FAILURE;
    local_88 = &(this->super_ServerOperation).statusMessage;
    local_40 = (this->super_ServerOperation).SUCCESS;
    iVar11 = 0;
    iVar4 = 1;
    while( true ) {
      pdVar6 = readdir(__dirp);
      if ((pdVar6 == (dirent *)0x0) || (this->chosen_message < iVar11)) break;
      if (pdVar6->d_type == '\b') {
        iVar11 = iVar11 + 1;
        if (iVar11 == this->chosen_message) {
          local_60[0] = local_50;
          sVar7 = strlen(pdVar6->d_name);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,pdVar6->d_name,pdVar6->d_name + sVar7);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_60,0,(char *)0x0,0x107270);
          psVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_b0.field_2._M_allocated_capacity = *psVar9;
            local_b0.field_2._8_8_ = puVar8[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar9;
            local_b0._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_b0._M_string_length = puVar8[1];
          *puVar8 = psVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_b0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if (local_60[0] != local_50) {
            operator_delete(local_60[0]);
          }
          iVar4 = remove((char *)local_80);
          pcVar2 = local_38;
          pcVar1 = local_40;
          if (iVar4 == 0) {
            local_90 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
            strlen(local_40);
            iVar4 = 0;
            std::__cxx11::string::_M_replace((ulong)local_88,0,local_90,(ulong)pcVar1);
          }
          else {
            local_90 = (char *)(this->super_ServerOperation).statusMessage._M_string_length;
            strlen(local_38);
            std::__cxx11::string::_M_replace((ulong)local_88,0,local_90,(ulong)pcVar2);
          }
        }
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (iVar4 == 0) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"Message deleted","");
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"Delete not successful","");
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

string DeleteMessage::execute() {
    int count = 0;
    int delete_result = 1;
    ///create and parse a path to the correct user directory
    string dir = string(MESSAGEDIR) + "/" + username;

    ///open the user directory with the input path
    DIR* userDir = opendir(dir.c_str()); //Open User Directory

    struct dirent * userDirEntry; //individual entries in the directory.

    ///if no directory found return 0
    if(userDir == nullptr){
        statusMessage = FAILURE;
        closedir(userDir);
        return "No such User \"" + username + "\" found\n";
    }

    ///while directory isn't empty or didn't reach right file keep looking:
    while ((userDirEntry = readdir(userDir)) != nullptr && count <= chosen_message) {
        ///check if the file is a regular type
        if (userDirEntry->d_type == DT_REG) {
            //count as countable file
            count++;
            if (count == chosen_message) {
                //deleting if reached correct file
                dir += "/" + string(userDirEntry->d_name);
                delete_result = remove(dir.c_str());
                ///check if remove function returned 0 for success or other code for failure
                if(delete_result == 0){
                    statusMessage = SUCCESS;
                }else{
                    statusMessage = FAILURE;
                }
            }
        }
    }

    ///return the correct string to give user the information about success or failure
    if(delete_result == 0){
        return "Message deleted";
    }else{
        return "Delete not successful";
    }
}